

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_1::AggregateErrorCollector::AddError
          (AggregateErrorCollector *this,int param_1,int param_2,string *message)

{
  if ((this->error_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->error_);
  }
  std::__cxx11::string::_M_append((char *)&this->error_,(ulong)(message->_M_dataplus)._M_p);
  return;
}

Assistant:

void AddError(int /* line */, int /* column */,
                const std::string& message) override {
    if (!error_.empty()) {
      error_ += "; ";
    }
    error_ += message;
  }